

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry_const&>
          (QMovableArrayOps<QPixmapIconEngineEntry> *this,qsizetype i,QPixmapIconEngineEntry *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QPixmapIconEngineEntry> *in_RSI;
  QArrayDataPointer<QPixmapIconEngineEntry> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPixmapIconEngineEntry tmp;
  QPixmapIconEngineEntry *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar6;
  GrowthPosition where;
  undefined1 local_48 [64];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QPixmapIconEngineEntry>::needsDetach
                    ((QArrayDataPointer<QPixmapIconEngineEntry> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QPixmapIconEngineEntry> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QPixmapIconEngineEntry>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QPixmapIconEngineEntry>::end
                ((QArrayDataPointer<QPixmapIconEngineEntry> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QPixmapIconEngineEntry::QPixmapIconEngineEntry
                ((QPixmapIconEngineEntry *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00298698;
    }
    if ((in_RSI == (QArrayDataPointer<QPixmapIconEngineEntry> *)0x0) &&
       (qVar3 = QArrayDataPointer<QPixmapIconEngineEntry>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QPixmapIconEngineEntry>::begin
                ((QArrayDataPointer<QPixmapIconEngineEntry> *)0x29856a);
      QPixmapIconEngineEntry::QPixmapIconEngineEntry
                ((QPixmapIconEngineEntry *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00298698;
    }
  }
  memset(local_48,0xaa,0x40);
  QPixmapIconEngineEntry::QPixmapIconEngineEntry
            ((QPixmapIconEngineEntry *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
             ,in_stack_ffffffffffffff58);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QPixmapIconEngineEntry> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QPixmapIconEngineEntry> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QPixmapIconEngineEntry>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff74,uVar2))),
             (QPixmapIconEngineEntry **)in_RDI,
             (QArrayDataPointer<QPixmapIconEngineEntry> *)CONCAT17(uVar5,in_stack_ffffffffffffff60))
  ;
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff74,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff60),
                       (qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
  }
  else {
    QArrayDataPointer<QPixmapIconEngineEntry>::begin
              ((QArrayDataPointer<QPixmapIconEngineEntry> *)0x29862c);
    QPixmapIconEngineEntry::QPixmapIconEngineEntry
              ((QPixmapIconEngineEntry *)CONCAT17(uVar5,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QPixmapIconEngineEntry::~QPixmapIconEngineEntry
            ((QPixmapIconEngineEntry *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
LAB_00298698:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }